

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  BYTE *source;
  BYTE *pBVar3;
  bool bVar4;
  U32 maxSymbolValue;
  uint maxNbBits;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  symbolEncodingType_e sVar11;
  size_t err_code_2;
  ulong sourceSize;
  ulong uVar12;
  bool bVar13;
  undefined8 uVar14;
  HUF_repeat local_94;
  ZSTD_symbolEncodingTypeStats_t local_58;
  
  source = seqStorePtr->litStart;
  pBVar3 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  ZVar2 = cctxParams->literalCompressionMode;
  bVar13 = true;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 == ZSTD_fast) {
      bVar13 = (cctxParams->cParams).targetLength == 0;
    }
  }
  else if (ZVar2 != ZSTD_ps_enable) {
    if (ZVar2 != ZSTD_ps_disable) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4652,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
    }
    bVar13 = false;
  }
  local_58.LLtype = 0xff;
  local_94 = (prevEntropy->huf).repeatMode;
  memcpy(nextEntropy,prevEntropy,0x810);
  if (bVar13) {
    sourceSize = (long)pBVar3 - (long)source;
    uVar9 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar9 = 6;
    }
    if (uVar9 < sourceSize) {
      sVar5 = HIST_count_wksp((uint *)workspace,&local_58.LLtype,source,sourceSize,workspace,
                              wkspSize);
      bVar13 = false;
      if (sVar5 < 0xffffffffffffff89) {
        sVar11 = set_rle;
        if (sVar5 != sourceSize) {
          sVar11 = set_basic;
          bVar13 = true;
          bVar4 = (sourceSize >> 7) + 4 < sVar5;
          sVar5 = 0;
          if (bVar4) goto LAB_001462ca;
        }
        (entropyMetadata->hufMetadata).hType = sVar11;
        bVar13 = false;
        sVar5 = 0;
      }
LAB_001462ca:
      if (!bVar13) goto LAB_001464f8;
      workSpace = (void *)((long)workspace + 0x400);
      sVar6 = wkspSize - 0x400;
      if (local_94 == HUF_repeat_check) {
        if ((int)local_58.LLtype < 0) {
          local_94 = HUF_repeat_check;
        }
        else {
          lVar10 = 0;
          bVar13 = false;
          do {
            bVar13 = (bool)(bVar13 | ((char)(prevEntropy->huf).CTable[lVar10 + 1] == '\0' &&
                                     *(int *)((long)workspace + lVar10 * 4) != 0));
            lVar10 = lVar10 + 1;
          } while ((ulong)local_58.LLtype + 1 != lVar10);
          local_94 = (HUF_repeat)!bVar13;
        }
      }
      memset(nextEntropy,0,0x808);
      maxSymbolValue = local_58.LLtype;
      uVar9 = (ulong)local_58.LLtype;
      maxNbBits = HUF_optimalTableLog(0xb,sourceSize,local_58.LLtype,workSpace,sVar6,
                                      (HUF_CElt *)nextEntropy,(uint *)workspace,
                                      (uint)(ZSTD_btopt < ZVar1) * 2);
      if (0xb < maxNbBits) {
        __assert_fail("huffLog <= LitHufLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5e8e,
                      "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                     );
      }
      sVar7 = HUF_buildCTable_wksp
                        ((HUF_CElt *)nextEntropy,(uint *)workspace,maxSymbolValue,maxNbBits,
                         workSpace,sVar6);
      if (0xffffffffffffff88 < sVar7) {
        sVar5 = sVar7;
      }
      if (0xffffffffffffff88 < sVar7) goto LAB_001464f8;
      if ((int)maxSymbolValue < 0) {
        uVar12 = 0;
      }
      else {
        lVar10 = 0;
        uVar12 = 0;
        do {
          uVar12 = uVar12 + (ulong)*(uint *)((long)workspace + lVar10 * 4) *
                            (ulong)(byte)(nextEntropy->huf).CTable[lVar10 + 1];
          lVar10 = lVar10 + 1;
        } while (uVar9 + 1 != lVar10);
        uVar12 = uVar12 >> 3;
      }
      sVar6 = HUF_writeCTable_wksp
                        ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                         maxSymbolValue,(uint)sVar7,workSpace,sVar6);
      if (local_94 != HUF_repeat_none) {
        if ((int)maxSymbolValue < 0) {
          uVar8 = 0;
        }
        else {
          lVar10 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 + (ulong)*(uint *)((long)workspace + lVar10 * 4) *
                            (ulong)(byte)(prevEntropy->huf).CTable[lVar10 + 1];
            lVar10 = lVar10 + 1;
          } while (uVar9 + 1 != lVar10);
          uVar8 = uVar8 >> 3;
        }
        bVar13 = true;
        if ((uVar8 < sourceSize) && ((sourceSize <= sVar6 + 0xc || (uVar8 <= sVar6 + uVar12)))) {
          memcpy(nextEntropy,prevEntropy,0x810);
          (entropyMetadata->hufMetadata).hType = set_repeat;
          bVar13 = false;
          sVar5 = 0;
        }
        if (!bVar13) goto LAB_001464f8;
      }
      if (uVar12 + sVar6 < sourceSize) {
        (entropyMetadata->hufMetadata).hType = set_compressed;
        (nextEntropy->huf).repeatMode = HUF_repeat_check;
        sVar5 = sVar6;
        goto LAB_001464f8;
      }
      memcpy(nextEntropy,prevEntropy,0x810);
    }
  }
  (entropyMetadata->hufMetadata).hType = set_basic;
  sVar5 = 0;
LAB_001464f8:
  (entropyMetadata->hufMetadata).hufDesSize = sVar5;
  if (sVar5 < 0xffffffffffffff89) {
    lVar10 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
    if (lVar10 == 0) {
      (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
      uVar14 = 0;
      local_58.lastCountSize = 0;
      local_58.size = 0;
      local_58.MLtype = set_basic;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&local_58,seqStorePtr,lVar10 >> 3,&prevEntropy->fse,&nextEntropy->fse,
                 (entropyMetadata->fseMetadata).fseTablesBuffer,
                 &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
                 (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
      uVar14 = CONCAT44(local_58.Offtype,local_58.LLtype);
    }
    if (local_58.size < 0xffffffffffffff89) {
      (entropyMetadata->fseMetadata).llType = (int)uVar14;
      (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar14 >> 0x20);
      (entropyMetadata->fseMetadata).mlType = local_58.MLtype;
      (entropyMetadata->fseMetadata).lastCountSize = local_58.lastCountSize;
    }
    (entropyMetadata->fseMetadata).fseTablesSize = local_58.size;
    sVar5 = 0;
    if (0xffffffffffffff88 < local_58.size) {
      sVar5 = local_58.size;
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}